

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

RAMBlock *
qemu_ram_alloc_from_ptr_sparc(uc_struct_conflict8 *uc,ram_addr_t size,void *host,MemoryRegion *mr)

{
  anon_struct_8_1_e05e5bab_for_blocks *paVar1;
  uc_struct *uc_00;
  ulong uVar2;
  uc_struct_conflict8 *uc_01;
  RAMBlock *pRVar3;
  ram_addr_t rVar4;
  uint8_t *puVar5;
  RAMBlock *pRVar6;
  uc_struct_conflict8 *puVar7;
  ulong uVar8;
  RAMBlock *pRVar9;
  MemoryRegion *mr_00;
  RAMBlock *pRVar10;
  ulong uVar11;
  ulong uVar12;
  uc_struct_conflict8 *puVar13;
  bool bVar14;
  
  uc_01 = (uc_struct_conflict8 *)size;
  if (host == (void *)0x0) {
    uc_01 = (uc_struct_conflict8 *)(-uc->qemu_host_page_size & (uc->qemu_host_page_size + size) - 1)
    ;
  }
  pRVar3 = (RAMBlock *)g_malloc0(0x48);
  if (pRVar3 == (RAMBlock *)0x0) {
    return (RAMBlock *)0x0;
  }
  pRVar3->mr = mr;
  pRVar3->used_length = (ram_addr_t)uc_01;
  pRVar3->max_length = (ram_addr_t)uc_01;
  pRVar3->page_size = uc->qemu_real_host_page_size;
  pRVar3->host = (uint8_t *)host;
  if (host != (void *)0x0) {
    *(byte *)&pRVar3->flags = (byte)pRVar3->flags | 1;
  }
  uc->invalid_addr = 0;
  if (uc_01 == (uc_struct_conflict8 *)0x0) {
    __assert_fail("size != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                  ,0x3d6,"ram_addr_t find_ram_offset(struct uc_struct *, ram_addr_t)");
  }
  uc_00 = (uc_struct *)mr->uc;
  if ((uc_00->ram_list).blocks.lh_first == (RAMBlock *)0x0) {
LAB_009d404e:
    rVar4 = 0;
  }
  else {
    pRVar6 = (uc_00->ram_list).blocks.lh_first;
    if ((uc_00->ram_list).freed == true) {
      if (pRVar6 == (RAMBlock *)0x0) {
        rVar4 = 0xffffffffffffffff;
      }
      else {
        puVar7 = (uc_struct_conflict8 *)0xffffffffffffffff;
        rVar4 = 0xffffffffffffffff;
        pRVar10 = pRVar6;
        do {
          uVar11 = pRVar10->offset + pRVar10->max_length + 0x3ffff & 0xfffffffffffc0000;
          uVar8 = 0xffffffffffffffff;
          pRVar9 = pRVar6;
          do {
            uVar2 = pRVar9->offset;
            pRVar9 = (pRVar9->next).le_next;
            uVar12 = uVar2;
            if (uVar8 < uVar2) {
              uVar12 = uVar8;
            }
            if (uVar2 < uVar11) {
              uVar12 = uVar8;
            }
            uVar8 = uVar12;
          } while (pRVar9 != (RAMBlock *)0x0);
          puVar13 = (uc_struct_conflict8 *)(uVar12 - uVar11);
          if (uc_01 <= puVar13 && puVar13 < puVar7) {
            puVar7 = puVar13;
            rVar4 = uVar11;
          }
          pRVar10 = (pRVar10->next).le_next;
        } while (pRVar10 != (RAMBlock *)0x0);
        size = 0;
      }
      if (rVar4 == 0xffffffffffffffff) {
        qemu_ram_alloc_from_ptr_sparc_cold_1();
        pRVar3 = qemu_ram_alloc_from_ptr_sparc(uc_01,size,(void *)0x0,mr_00);
        return pRVar3;
      }
    }
    else {
      if (pRVar6 == (RAMBlock *)0x0) goto LAB_009d404e;
      rVar4 = 0;
      do {
        uVar8 = pRVar6->max_length + pRVar6->offset;
        if (rVar4 < uVar8) {
          rVar4 = uVar8;
        }
        pRVar6 = (pRVar6->next).le_next;
      } while (pRVar6 != (RAMBlock *)0x0);
    }
  }
  pRVar3->offset = rVar4;
  if (host == (void *)0x0) {
    puVar5 = (uint8_t *)qemu_anon_ram_alloc(uc_00,(size_t)uc_01,&mr->align);
    pRVar3->host = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      uc_00->invalid_error = 1;
      goto LAB_009d413c;
    }
  }
  paVar1 = &(uc_00->ram_list).blocks;
  pRVar6 = paVar1->lh_first;
  bVar14 = pRVar6 == (RAMBlock *)0x0;
  pRVar10 = pRVar6;
  if (bVar14) {
    pRVar9 = (RAMBlock *)0x0;
  }
  else {
    pRVar9 = pRVar6;
    if (pRVar6->max_length < pRVar3->max_length) {
      bVar14 = false;
    }
    else {
      do {
        pRVar10 = (pRVar9->next).le_next;
        bVar14 = pRVar10 == (RAMBlock *)0x0;
        if (bVar14) break;
        pRVar9 = pRVar10;
      } while (pRVar3->max_length <= pRVar10->max_length);
    }
  }
  if (bVar14) {
    if (pRVar9 == (RAMBlock *)0x0) {
      (pRVar3->next).le_prev = &paVar1->lh_first;
      (pRVar3->next).le_next = pRVar6;
      paVar1->lh_first = pRVar3;
    }
    else {
      (pRVar3->next).le_next = (pRVar9->next).le_next;
      (pRVar3->next).le_prev = &(pRVar9->next).le_next;
      (pRVar9->next).le_next = pRVar3;
    }
    pRVar6 = (pRVar3->next).le_next;
    if (pRVar6 != (RAMBlock *)0x0) {
      (pRVar6->next).le_prev = &(pRVar3->next).le_next;
    }
  }
  else {
    (pRVar3->next).le_prev = (pRVar10->next).le_prev;
    (pRVar3->next).le_next = pRVar10;
    *(pRVar10->next).le_prev = pRVar3;
    (pRVar10->next).le_prev = &(pRVar3->next).le_next;
  }
  (uc_00->ram_list).mru_block = (RAMBlock *)0x0;
LAB_009d413c:
  if (uc->invalid_error != 0) {
    g_free(pRVar3);
    return (RAMBlock *)0x0;
  }
  return pRVar3;
}

Assistant:

RAMBlock *qemu_ram_alloc_from_ptr(struct uc_struct *uc, ram_addr_t size, void *host,
                                   MemoryRegion *mr)
{
    RAMBlock *new_block;
    ram_addr_t max_size = size;

    // Don't resize pre-alloced memory as they are given by users.
    if (!host) {
        size = HOST_PAGE_ALIGN(uc, size);
        max_size = HOST_PAGE_ALIGN(uc, max_size);
    }

    new_block = g_malloc0(sizeof(*new_block));
    if (new_block == NULL)
        return NULL;
    new_block->mr = mr;
    new_block->used_length = size;
    new_block->max_length = max_size;
    assert(max_size >= size);
    new_block->page_size = uc->qemu_real_host_page_size;
    new_block->host = host;
    if (host) {
        new_block->flags |= RAM_PREALLOC;
    }

    uc->invalid_addr = UC_ERR_OK;
    ram_block_add(mr->uc, new_block);

    if (uc->invalid_error != UC_ERR_OK) {
        g_free(new_block);
        return NULL;
    }

    return new_block;
}